

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextIO.cpp
# Opt level: O3

void __thiscall
LogMsgTy::LogMsgTy(LogMsgTy *this,char *_fn,int _ln,char *_func,logLevelTy _lvl,char *_msg)

{
  rep rVar1;
  float fVar2;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  
  gLogCnt = gLogCnt + 1;
  this->counter = gLogCnt;
  rVar1 = std::chrono::_V2::system_clock::now();
  (this->wallTime).__d.__r = rVar1;
  fVar2 = DataRefs::GetMiscNetwTime(&dataRefs);
  this->netwTime = fVar2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->fileName,_fn,&local_31);
  this->ln = _ln;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->func,_func,&local_32);
  this->lvl = _lvl;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->msg,_msg,&local_33);
  this->bFlushed = false;
  str_replPers(&this->msg);
  return;
}

Assistant:

LogMsgTy::LogMsgTy (const char* _fn, int _ln, const char* _func,
                    logLevelTy _lvl, const char* _msg) :
counter(++gLogCnt),
wallTime(std::chrono::system_clock::now()),
netwTime(dataRefs.GetMiscNetwTime()),
fileName(_fn), ln(_ln), func(_func), lvl(_lvl), msg(_msg), bFlushed(false)
{
    // Remove personal information
    str_replPers(msg);

}